

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,_2,_2>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_2,_2>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_> *dst)

{
  float *pfVar1;
  Vector<float,_2> *pVVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> scalars;
  Value mat;
  vector<float,_std::allocator<float>_> local_48;
  value_type local_28;
  
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_48);
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar5 = 0;
    do {
      local_28.m_data.m_data[0].m_data[0] = 0.0;
      local_28.m_data.m_data[0].m_data[1] = 0.0;
      local_28.m_data.m_data[1].m_data[0] = 0.0;
      local_28.m_data.m_data[1].m_data[1] = 0.0;
      pfVar1 = (float *)&local_28;
      lVar3 = 0;
      do {
        lVar4 = 0;
        do {
          if (lVar3 == lVar4) {
            fVar7 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
          }
          else {
            fVar7 = 0.0;
          }
          pfVar1[lVar4 * 2] = fVar7;
          lVar4 = lVar4 + 1;
        } while (lVar4 == 1);
        pfVar1 = pfVar1 + 1;
        bVar6 = lVar3 == 0;
        lVar3 = lVar3 + 1;
      } while (bVar6);
      std::vector<tcu::Matrix<float,2,2>,std::allocator<tcu::Matrix<float,2,2>>>::
      emplace_back<tcu::Matrix<float,2,2>>
                ((vector<tcu::Matrix<float,2,2>,std::allocator<tcu::Matrix<float,2,2>>> *)dst,
                 &local_28);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_48.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_48.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  pfVar1 = (float *)&local_28;
  local_28.m_data.m_data[0].m_data[0] = 0.0;
  local_28.m_data.m_data[0].m_data[1] = 0.0;
  local_28.m_data.m_data[1].m_data[0] = 0.0;
  local_28.m_data.m_data[1].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      pfVar1[lVar4 * 2] = 0.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    pfVar1 = pfVar1 + 1;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  pVVar2 = local_28.m_data.m_data + 1;
  local_28.m_data.m_data[0].m_data[0] = 1.0;
  fVar7 = 1.0;
  lVar3 = 0;
  do {
    pVVar2->m_data[0] = fVar7;
    fVar7 = fVar7 + fVar7;
    lVar3 = lVar3 + 1;
    pVVar2 = (Vector<float,_2> *)
             (((Vector<tcu::Vector<float,_2>,_2> *)(pVVar2 + -1))->m_data[0].m_data + 1);
  } while (lVar3 == 1);
  std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::push_back
            (dst,&local_28);
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}